

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseFlexBufferValue(Parser *this,Builder *builder)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  char cVar4;
  size_t start_00;
  int64_t i;
  char *pcVar5;
  undefined8 in_RDX;
  int t;
  anon_class_16_2_dbef1248 body;
  allocator<char> local_101;
  string local_100 [37];
  byte local_db;
  undefined1 local_da;
  byte local_d9;
  char sign;
  double dStack_d8;
  double d;
  Builder *local_c8;
  int *local_c0;
  byte local_b1;
  undefined1 local_b0 [8];
  size_t count;
  size_t start_1;
  string local_98 [48];
  Builder *local_68;
  undefined1 local_5a [8];
  CheckedError err;
  size_t fieldn_outer;
  size_t start;
  undefined1 local_30 [8];
  ParseDepthGuard depth_guard;
  Builder *builder_local;
  Parser *this_local;
  CheckedError *ce;
  
  depth_guard._8_8_ = in_RDX;
  ParseDepthGuard::ParseDepthGuard((ParseDepthGuard *)local_30,(Parser *)builder);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  bVar3 = CheckedError::Check((CheckedError *)this);
  if (bVar3) goto LAB_0012dca3;
  CheckedError::~CheckedError((CheckedError *)this);
  iVar1 = *(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  if ((iVar1 == 0x2b) || (iVar1 == 0x2d)) {
    local_da = *(undefined1 *)
                ((long)&(builder->stack_).
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4);
    local_db = 0;
    Next(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_db = 1;
    }
    if ((local_db & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (bVar3) goto LAB_0012dca3;
    if (*(int *)((long)&(builder->stack_).
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"floating-point constant expected",&local_101);
      Error(this,(string *)builder);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
      goto LAB_0012dca3;
    }
    std::__cxx11::string::insert
              ((ulong)&(builder->stack_).
                       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,'\x01');
    ParseFlexBufferNumericConstant(this,builder);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) goto LAB_0012dca3;
    CheckedError::~CheckedError((CheckedError *)this);
    Next(this);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) goto LAB_0012dca3;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  else if (iVar1 == 0x5b) {
    count = flexbuffers::Builder::StartVector((Builder *)depth_guard._8_8_);
    local_b0 = (undefined1  [8])0x0;
    local_b1 = 0;
    local_c0 = &depth_guard.caller_depth_;
    body.builder = (Builder **)builder;
    body.this = (Parser *)local_b0;
    local_c8 = builder;
    ParseVectorDelimiters<flatbuffers::Parser::ParseFlexBufferValue(flexbuffers::Builder*)::__1>
              (this,(size_t *)builder,body);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_b1 = 1;
    }
    if ((local_b1 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (bVar3) goto LAB_0012dca3;
    flexbuffers::Builder::EndVector((Builder *)depth_guard._8_8_,count,false,false);
  }
  else if (iVar1 == 0x7b) {
    start_00 = flexbuffers::Builder::StartMap((Builder *)depth_guard._8_8_);
    stack0xffffffffffffffa8 = (pointer)0x0;
    local_98._40_8_ = &depth_guard.caller_depth_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_98._40_8_;
    local_68 = builder;
    ParseTableDelimiters<flatbuffers::Parser::ParseFlexBufferValue(flexbuffers::Builder*)::__0>
              ((Parser *)local_5a,(size_t *)builder,(StructDef *)(local_5a + 2),
               (anon_class_16_2_29deed5a)(auVar2 << 0x40));
    local_98[0x27] = (string)0x0;
    CheckedError::CheckedError((CheckedError *)this,(CheckedError *)local_5a);
    cVar4 = CheckedError::Check((CheckedError *)this);
    if ((bool)cVar4) {
      local_98[0x27] = (string)0x1;
    }
    if (((byte)local_98[0x27] & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!(bool)cVar4) {
      flexbuffers::Builder::EndMap((Builder *)depth_guard._8_8_,start_00);
      bVar3 = flexbuffers::Builder::HasDuplicateKeys((Builder *)depth_guard._8_8_);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_98,"FlexBuffers map has duplicate keys",
                   (allocator<char> *)((long)&start_1 + 7));
        Error(this,(string *)builder);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&start_1 + 7));
        cVar4 = '\x01';
      }
      else {
        cVar4 = '\x02';
      }
    }
    CheckedError::~CheckedError((CheckedError *)local_5a);
    if (cVar4 != '\x02') goto LAB_0012dca3;
  }
  else {
    t = (int)builder;
    if (iVar1 == 0x101) {
      flexbuffers::Builder::String
                ((Builder *)depth_guard._8_8_,
                 (string *)
                 &(builder->stack_).
                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      d._7_1_ = 0;
      Expect(this,t);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        d._7_1_ = 1;
      }
      if ((d._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar3) goto LAB_0012dca3;
    }
    else if (iVar1 == 0x102) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      i = StringToInt(pcVar5,10);
      flexbuffers::Builder::Int((Builder *)depth_guard._8_8_,i);
      d._6_1_ = 0;
      Expect(this,t);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        d._6_1_ = 1;
      }
      if ((d._6_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar3) goto LAB_0012dca3;
    }
    else if (iVar1 == 0x103) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      StringToNumber<double>(pcVar5,&stack0xffffffffffffff28);
      flexbuffers::Builder::Double((Builder *)depth_guard._8_8_,dStack_d8);
      local_d9 = 0;
      Expect(this,t);
      bVar3 = CheckedError::Check((CheckedError *)this);
      if (bVar3) {
        local_d9 = 1;
      }
      if ((local_d9 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar3) goto LAB_0012dca3;
    }
    else {
      bVar3 = IsIdent((Parser *)builder,"true");
      if (bVar3) {
        flexbuffers::Builder::Bool((Builder *)depth_guard._8_8_,true);
        Next(this);
        bVar3 = CheckedError::Check((CheckedError *)this);
        if (bVar3) goto LAB_0012dca3;
        CheckedError::~CheckedError((CheckedError *)this);
      }
      else {
        bVar3 = IsIdent((Parser *)builder,"false");
        if (bVar3) {
          flexbuffers::Builder::Bool((Builder *)depth_guard._8_8_,false);
          Next(this);
          bVar3 = CheckedError::Check((CheckedError *)this);
          if (bVar3) goto LAB_0012dca3;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        else {
          bVar3 = IsIdent((Parser *)builder,"null");
          if (bVar3) {
            flexbuffers::Builder::Null((Builder *)depth_guard._8_8_);
            Next(this);
            bVar3 = CheckedError::Check((CheckedError *)this);
            if (bVar3) goto LAB_0012dca3;
            CheckedError::~CheckedError((CheckedError *)this);
          }
          else {
            bVar3 = IsIdent((Parser *)builder,"inf");
            if (((!bVar3) && (bVar3 = IsIdent((Parser *)builder,"infinity"), !bVar3)) &&
               (bVar3 = IsIdent((Parser *)builder,"nan"), !bVar3)) {
              TokenError(this);
              goto LAB_0012dca3;
            }
            ParseFlexBufferNumericConstant(this,builder);
            bVar3 = CheckedError::Check((CheckedError *)this);
            if (bVar3) goto LAB_0012dca3;
            CheckedError::~CheckedError((CheckedError *)this);
            Next(this);
            bVar3 = CheckedError::Check((CheckedError *)this);
            if (bVar3) goto LAB_0012dca3;
            CheckedError::~CheckedError((CheckedError *)this);
          }
        }
      }
    }
  }
  anon_unknown_0::NoError();
LAB_0012dca3:
  ParseDepthGuard::~ParseDepthGuard((ParseDepthGuard *)local_30);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFlexBufferValue(flexbuffers::Builder *builder) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  switch (token_) {
    case '{': {
      auto start = builder->StartMap();
      size_t fieldn_outer = 0;
      auto err =
          ParseTableDelimiters(fieldn_outer, nullptr,
                               [&](const std::string &name, size_t &fieldn,
                                   const StructDef *) -> CheckedError {
                                 builder->Key(name);
                                 ECHECK(ParseFlexBufferValue(builder));
                                 fieldn++;
                                 return NoError();
                               });
      ECHECK(err);
      builder->EndMap(start);
      if (builder->HasDuplicateKeys())
        return Error("FlexBuffers map has duplicate keys");
      break;
    }
    case '[': {
      auto start = builder->StartVector();
      size_t count = 0;
      ECHECK(ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
        return ParseFlexBufferValue(builder);
      }));
      builder->EndVector(start, false, false);
      break;
    }
    case kTokenStringConstant:
      builder->String(attribute_);
      EXPECT(kTokenStringConstant);
      break;
    case kTokenIntegerConstant:
      builder->Int(StringToInt(attribute_.c_str()));
      EXPECT(kTokenIntegerConstant);
      break;
    case kTokenFloatConstant: {
      double d;
      StringToNumber(attribute_.c_str(), &d);
      builder->Double(d);
      EXPECT(kTokenFloatConstant);
      break;
    }
    case '-':
    case '+': {
      // `[-+]?(nan|inf|infinity)`, see ParseSingleValue().
      const auto sign = static_cast<char>(token_);
      NEXT();
      if (token_ != kTokenIdentifier)
        return Error("floating-point constant expected");
      attribute_.insert(size_t(0), size_t(1), sign);
      ECHECK(ParseFlexBufferNumericConstant(builder));
      NEXT();
      break;
    }
    default:
      if (IsIdent("true")) {
        builder->Bool(true);
        NEXT();
      } else if (IsIdent("false")) {
        builder->Bool(false);
        NEXT();
      } else if (IsIdent("null")) {
        builder->Null();
        NEXT();
      } else if (IsIdent("inf") || IsIdent("infinity") || IsIdent("nan")) {
        ECHECK(ParseFlexBufferNumericConstant(builder));
        NEXT();
      } else
        return TokenError();
  }
  return NoError();
}